

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserColour.cpp
# Opt level: O2

bool __thiscall
Rml::PropertyParserColour::ParseValue
          (PropertyParserColour *this,Property *property,String *value,ParameterMap *param_3)

{
  bool bVar1;
  Colourb local_44;
  Variant local_40;
  
  local_44.red = '\0';
  local_44.green = '\0';
  local_44.blue = '\0';
  local_44.alpha = 0xff;
  bVar1 = ParseColour(&local_44,value);
  if (bVar1) {
    Variant::Variant<Rml::Colour<unsigned_char,255,false>&,void>(&local_40,&local_44);
    Variant::operator=(&property->value,&local_40);
    Variant::~Variant(&local_40);
    property->unit = COLOUR;
  }
  return bVar1;
}

Assistant:

bool PropertyParserColour::ParseValue(Property& property, const String& value, const ParameterMap& /*parameters*/) const
{
	Colourb colour;
	if (!ParseColour(colour, value))
		return false;

	property.value = Variant(colour);
	property.unit = Unit::COLOUR;

	return true;
}